

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Parser::Parser(Parser *this,TokenList *tokens,bool is_binary)

{
  Scope *this_00;
  
  this->tokens = tokens;
  this->last = (TokenPtr)0x0;
  this->current = (TokenPtr)0x0;
  (this->cursor)._M_current =
       (tokens->
       super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->root)._M_t.
  super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
  super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl = (Scope *)0x0;
  this->is_binary = is_binary;
  this_00 = (Scope *)operator_new(0x30);
  Scope::Scope(this_00,this,true);
  std::__uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::reset
            ((__uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_> *)
             &this->root,this_00);
  return;
}

Assistant:

Parser::Parser (const TokenList& tokens, bool is_binary)
: tokens(tokens)
, last()
, current()
, cursor(tokens.begin())
, is_binary(is_binary)
{
    root.reset(new Scope(*this,true));
}